

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConcatNDLayerParams::ConcatNDLayerParams
          (ConcatNDLayerParams *this,ConcatNDLayerParams *from)

{
  InternalMetadataWithArenaLite *this_00;
  ConcatNDLayerParams *from_local;
  ConcatNDLayerParams *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ConcatNDLayerParams_00629650;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  memcpy(&this->axis_,&from->axis_,9);
  return;
}

Assistant:

ConcatNDLayerParams::ConcatNDLayerParams(const ConcatNDLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&axis_, &from.axis_,
    reinterpret_cast<char*>(&interleave_) -
    reinterpret_cast<char*>(&axis_) + sizeof(interleave_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ConcatNDLayerParams)
}